

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

void linreg_clrm(double *x,double *y,int N,double *b,double *var,double *res,double alpha,
                double *anv,double *ci_lower,double *ci_upper)

{
  int df;
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar3 = mean(x,N);
  dVar4 = mean(y,N);
  dVar6 = 0.0;
  dVar11 = 0.0;
  dVar5 = 0.0;
  dVar7 = 0.0;
  dVar8 = 0.0;
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar1 = x[uVar2];
      dVar9 = dVar1 - dVar3;
      dVar10 = y[uVar2] - dVar4;
      dVar8 = dVar8 + dVar9 * dVar10;
      dVar7 = dVar7 + dVar9 * dVar9;
      dVar5 = dVar5 + dVar1 * dVar1;
      dVar11 = dVar11 + dVar10 * dVar10;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  b[1] = dVar8 / dVar7;
  *b = dVar4 - (dVar8 / dVar7) * dVar3;
  if (0 < N) {
    dVar6 = 0.0;
    uVar2 = 0;
    do {
      dVar4 = (y[uVar2] - *b) - b[1] * x[uVar2];
      res[uVar2] = dVar4;
      dVar6 = dVar6 + dVar4 * dVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  df = N + -2;
  dVar8 = (double)df;
  dVar6 = dVar6 / dVar8;
  *var = dVar6;
  dVar4 = (dVar5 * dVar6) / ((double)N * dVar7);
  var[1] = dVar4;
  var[2] = dVar6 / dVar7;
  var[3] = -dVar3 * (dVar6 / dVar7);
  var[4] = (b[1] * b[1] * dVar7) / dVar11;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar3 = var[2];
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar5 = alpha * 0.5;
  dVar6 = tinv(dVar5,df);
  *ci_lower = *b - dVar4 * dVar6;
  *ci_upper = dVar4 * dVar6 + *b;
  ci_lower[1] = b[1] - dVar3 * dVar6;
  ci_upper[1] = dVar3 * dVar6 + b[1];
  dVar3 = chiinv(dVar5,df);
  dVar4 = chiinv(1.0 - dVar5,df);
  ci_lower[2] = (*var * dVar8) / dVar4;
  ci_upper[2] = (*var * dVar8) / dVar3;
  *anv = dVar11;
  dVar3 = *var * dVar8;
  anv[2] = dVar3;
  anv[1] = dVar11 - dVar3;
  anv[3] = 1.0;
  anv[4] = dVar8;
  anv[5] = (dVar11 - dVar3) / (dVar3 / dVar8);
  printf("%lf \n",*var);
  dVar3 = fcdf(anv[5],1,df);
  anv[6] = 1.0 - dVar3;
  return;
}

Assistant:

void linreg_clrm(double *x, double *y, int N, double* b,
	double *var, double *res, double alpha, double *anv,
	double* ci_lower, double* ci_upper) {
	int i, df;
	double *xi;
	double *yi;
	double xm, ym, num, den, sum, den2, den3;
	double seb1, seb2, a2, ta2, intrvl, chia2, chi1a2;

	/*
	* Classic Linear Regression Model
	*
	* x,y and res are all of same length - N
	*
	* alpha is used to determine confidence interval limits
	* for a given 100*(1-alpha) % confidence interval
	*
	*
	* Alpha takes values between  0 and 1.
	*
	* For 95% confidence interval, the value of alpha is 0.05
	* For 90% confidence interval, the value of alpha is 0.10 etc.
	*/

	/*
	* Parameters
	* b[0] - beta1
	* b[1] - beta2
	*/

	/*
	* var[0] - variance of residuals
	* var[1] variance beta1
	* var[2] variance beta2
	* var[3] covariance beta1,beta2
	* var[4] r^2 Goodness of Fit
	*/

	/*
	* ANOVA
	*
	* anv[0] - TSS Total Sum Of Squares
	* anv[1] - ESS Explained Sum Of Squares
	* anv[2] - RSS Residual Sum Of Squares
	* anv[3] - degrees of freedom of ESS
	* anv[4] - degrees of freedom of RSS
	* anv[5] - F Statistics = (anv[1] / anv[3]) / (anv[2] / anv[4])
	* anv[6] - P value associated with anv[5] used to reject/accept
	* zero hypothesis
	*/

	xi = (double*)malloc(sizeof(double) * N);
	yi = (double*)malloc(sizeof(double) * N);

	xm = mean(x, N);
	ym = mean(y, N);
	num = 0.0;
	den = 0.0;
	den2 = 0.0;
	den3 = 0.0;
	sum = 0.0;

	for (i = 0; i < N; ++i) {
		xi[i] = x[i] - xm;
		yi[i] = y[i] - ym;
		num += xi[i] * yi[i];
		den += xi[i] * xi[i];
		den2 += x[i] * x[i];
		den3 += yi[i] * yi[i];
	}

	b[1] = num / den;
	b[0] = ym - b[1] * xm;
	num = 0.0;

	for (i = 0; i < N; ++i) {
		res[i] = y[i] - b[0] - b[1] * x[i];
		sum += res[i] * res[i];
	}


	var[0] = sum / (N - 2);
	var[1] = den2 * var[0] / (N * den);
	var[2] = var[0] / den;
	var[3] = -xm * var[2];
	var[4] = b[1] * b[1] * den / den3;
	//Confidence Interval Estimations for a given alpha value

	// Find standard errors seb1 and seb2 from variances

	seb1 = sqrt(var[1]);
	seb2 = sqrt(var[2]);

	a2 = alpha / 2.;
	df = N - 2; // Number of parameters = 2

	ta2 = tinv(a2, df);
	intrvl = ta2 * seb1;

	ci_lower[0] = b[0] - intrvl;
	ci_upper[0] = b[0] + intrvl;

	intrvl = ta2 * seb2;

	ci_lower[1] = b[1] - intrvl;
	ci_upper[1] = b[1] + intrvl;

	// confidence interval for sigma^2

	chia2 = chiinv(a2, df);
	chi1a2 = chiinv(1. - a2, df);

	ci_lower[2] = (double)df * var[0] / chi1a2;
	ci_upper[2] = (double)df * var[0] / chia2;

	// ANOVA

	df = N - 2;
	anv[0] = den3;
	anv[2] = var[0] * (double)df;
	anv[1] = den3 - anv[2];
	anv[3] = 1;
	anv[4] = (double)df;
	anv[5] = (anv[1] / anv[3]) / (anv[2] / anv[4]);
	printf("%lf \n", var[0]);
	anv[6] = 1.0 - fcdf(anv[5], 1, df);

	free(xi);
	free(yi);
}